

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

void bcf_hdr_remove(bcf_hdr_t *hdr,int type,char *key)

{
  khint_t kVar1;
  int iVar2;
  int local_54;
  kh_vdict_t *local_48;
  int j;
  khint_t k;
  vdict_t *d;
  bcf_hrec_t *hrec;
  int i;
  char *key_local;
  int type_local;
  bcf_hdr_t *hdr_local;
  
  do {
    if ((((type == 0) || (type == 1)) || (type == 2)) || (type == 3)) {
      d = (vdict_t *)bcf_hdr_get_hrec(hdr,type,"ID",key,(char *)0x0);
      if ((bcf_hrec_t *)d == (bcf_hrec_t *)0x0) {
        return;
      }
      for (hrec._4_4_ = 0; (hrec._4_4_ < hdr->nhrec && (hdr->hrec[hrec._4_4_] != (bcf_hrec_t *)d));
          hrec._4_4_ = hrec._4_4_ + 1) {
      }
      if (hdr->nhrec <= hrec._4_4_) {
        __assert_fail("i<hdr->nhrec",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                      ,0x269,"void bcf_hdr_remove(bcf_hdr_t *, int, const char *)");
      }
      if (type == 3) {
        local_48 = (kh_vdict_t *)hdr->dict[1];
      }
      else {
        local_48 = (kh_vdict_t *)hdr->dict[0];
      }
      kVar1 = kh_get_vdict(local_48,key);
      local_54 = type;
      if (type == 3) {
        local_54 = 0;
      }
      local_48->vals[kVar1].hrec[local_54] = (bcf_hrec_t *)0x0;
    }
    else {
      for (hrec._4_4_ = 0; hrec._4_4_ < hdr->nhrec; hrec._4_4_ = hrec._4_4_ + 1) {
        if (hdr->hrec[hrec._4_4_]->type == type) {
          if (type == 5) {
            iVar2 = strcmp(hdr->hrec[hrec._4_4_]->key,key);
          }
          else {
            iVar2 = bcf_hrec_find_key(hdr->hrec[hrec._4_4_],"ID");
            if (iVar2 < 0) goto LAB_0011f450;
            iVar2 = strcmp(hdr->hrec[hrec._4_4_]->vals[iVar2],key);
          }
          if (iVar2 == 0) break;
        }
LAB_0011f450:
      }
      if (hrec._4_4_ == hdr->nhrec) {
        return;
      }
      d = (vdict_t *)hdr->hrec[hrec._4_4_];
    }
    hdr->nhrec = hdr->nhrec + -1;
    if (hrec._4_4_ < hdr->nhrec) {
      memmove(hdr->hrec + hrec._4_4_,hdr->hrec + (hrec._4_4_ + 1),
              (long)(hdr->nhrec - hrec._4_4_) << 3);
    }
    bcf_hrec_destroy((bcf_hrec_t *)d);
    hdr->dirty = 1;
  } while( true );
}

Assistant:

void bcf_hdr_remove(bcf_hdr_t *hdr, int type, const char *key)
{
    int i;
    bcf_hrec_t *hrec;
    while (1)
    {
        if ( type==BCF_HL_FLT || type==BCF_HL_INFO || type==BCF_HL_FMT || type== BCF_HL_CTG )
        {
            hrec = bcf_hdr_get_hrec(hdr, type, "ID", key, NULL);
            if ( !hrec ) return;

            for (i=0; i<hdr->nhrec; i++)
                if ( hdr->hrec[i]==hrec ) break;
            assert( i<hdr->nhrec );

            vdict_t *d = type==BCF_HL_CTG ? (vdict_t*)hdr->dict[BCF_DT_CTG] : (vdict_t*)hdr->dict[BCF_DT_ID];
            khint_t k = kh_get(vdict, d, key);
            kh_val(d, k).hrec[type==BCF_HL_CTG?0:type] = NULL;
        }
        else
        {
            for (i=0; i<hdr->nhrec; i++)
            {
                if ( hdr->hrec[i]->type!=type ) continue;
                if ( type==BCF_HL_GEN )
                {
                    if ( !strcmp(hdr->hrec[i]->key,key) ) break;
                }
                else
                {
                    // not all structured lines have ID, we could be more sophisticated as in bcf_hdr_get_hrec()
                    int j = bcf_hrec_find_key(hdr->hrec[i], "ID");
                    if ( j>=0 && !strcmp(hdr->hrec[i]->vals[j],key) ) break;
                }
            }
            if ( i==hdr->nhrec ) return;
            hrec = hdr->hrec[i];
        }

        hdr->nhrec--;
        if ( i < hdr->nhrec )
            memmove(&hdr->hrec[i],&hdr->hrec[i+1],(hdr->nhrec-i)*sizeof(bcf_hrec_t*));
        bcf_hrec_destroy(hrec);
        hdr->dirty = 1;
    }
}